

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

void guard_set(AD *ad)

{
  Pointer pcVar1;
  Pointer guard;
  Guard signature;
  AD *ad_local;
  
  pcVar1 = ad->client_space;
  pcVar1[-4] = -0x56;
  pcVar1[-3] = -0x56;
  pcVar1[-2] = -0x56;
  pcVar1[-1] = -0x56;
  builtin_strncpy(ad->client_space + ad->nelem * (long)ma_sizeof[ad->datatype],"UUUU",4);
  return;
}

Assistant:

private void guard_set(ad)
    AD        *ad;        /* the AD to set guards for */
{
    Guard    signature;    /* value to be written */
    Pointer    guard;        /* address to write to */

    signature = GUARD1;
    guard = guard1(ad);
    guard_write(guard, &signature);

    signature = GUARD2;
    guard = guard2(ad);
    guard_write(guard, &signature);
}